

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O3

void __thiscall
QAbstractScrollArea::addScrollBarWidget
          (QAbstractScrollArea *this,QWidget *widget,Alignment alignment)

{
  QAbstractScrollAreaPrivate *this_00;
  
  if (widget != (QWidget *)0x0) {
    this_00 = *(QAbstractScrollAreaPrivate **)(this + 8);
    QAbstractScrollAreaScrollBarContainer::addWidget
              ((this_00->scrollBarContainers).m_data
               [((uint)alignment.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                       super_QFlagsStorage<Qt::AlignmentFlag>.i & 3) == 0],widget,
               LogicalRight -
               (((uint)alignment.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                       super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x42) == 0));
    QAbstractScrollAreaPrivate::layoutChildren(this_00);
    if ((*(byte *)(*(long *)(this + 0x20) + 10) & 1) == 0) {
      QWidget::show(widget);
      return;
    }
  }
  return;
}

Assistant:

void QAbstractScrollArea::addScrollBarWidget(QWidget *widget, Qt::Alignment alignment)
{
    Q_D(QAbstractScrollArea);

    if (widget == nullptr)
        return;

    const Qt::Orientation scrollBarOrientation
        = ((alignment & Qt::AlignLeft) || (alignment & Qt::AlignRight)) ? Qt::Horizontal : Qt::Vertical;
    const QAbstractScrollAreaScrollBarContainer::LogicalPosition position
        = ((alignment & Qt::AlignRight) || (alignment & Qt::AlignBottom))
          ? QAbstractScrollAreaScrollBarContainer::LogicalRight : QAbstractScrollAreaScrollBarContainer::LogicalLeft;
    d->scrollBarContainers[scrollBarOrientation]->addWidget(widget, position);
    d->layoutChildren();
    if (isHidden() == false)
        widget->show();
}